

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool Memory::Recycler::WBCheckIsRecyclerAddress(char *addr)

{
  HeapBlock *pHVar1;
  Recycler *pRVar2;
  
  CCLock::Enter(&recyclerListLock.super_CCLock);
  for (pRVar2 = recyclerList; pRVar2 != (Recycler *)0x0; pRVar2 = pRVar2->next) {
    if (addr < (char *)0x10000) {
      pHVar1 = (HeapBlock *)0x0;
    }
    else {
      pHVar1 = HeapBlockMap64::GetHeapBlock
                         (&pRVar2->heapBlockMap,(void *)((ulong)addr & 0xfffffffffffffff0));
    }
    if (pHVar1 != (HeapBlock *)0x0) break;
  }
  CCLock::Leave(&recyclerListLock.super_CCLock);
  return pRVar2 != (Recycler *)0x0;
}

Assistant:

bool
Recycler::WBCheckIsRecyclerAddress(char* addr)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            return true;
        }
        recycler = recycler->next;
    }
    return false;
}